

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_segwit_tests.cpp
# Opt level: O0

void __thiscall
script_segwit_tests::IsWitnessProgram_Invalid_Size::test_method(IsWitnessProgram_Invalid_Size *this)

{
  long lVar1;
  span<const_unsigned_char,_18446744073709551615UL> b;
  span<const_unsigned_char,_18446744073709551615UL> b_00;
  bool bVar2;
  const_string *file;
  long in_FS_OFFSET;
  vector<unsigned_char,_std::allocator<unsigned_char>_> program;
  CScript nowit;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  *in_stack_fffffffffffffe18;
  undefined7 in_stack_fffffffffffffe20;
  undefined1 in_stack_fffffffffffffe27;
  assertion_result *in_stack_fffffffffffffe28;
  undefined7 in_stack_fffffffffffffe30;
  undefined1 in_stack_fffffffffffffe37;
  lazy_ostream *in_stack_fffffffffffffe38;
  undefined7 in_stack_fffffffffffffe40;
  undefined1 in_stack_fffffffffffffe47;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffe48;
  opcodetype opcode;
  size_t line_num;
  const_string *in_stack_fffffffffffffe50;
  undefined7 in_stack_fffffffffffffe58;
  undefined1 in_stack_fffffffffffffe5f;
  const_string local_158 [2];
  lazy_ostream local_138 [2];
  assertion_result local_118 [2];
  lazy_ostream local_b0 [2];
  assertion_result local_90 [2];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_fffffffffffffe18);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (in_stack_fffffffffffffe48,CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40)
             ,(allocator_type *)in_stack_fffffffffffffe38);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_fffffffffffffe18);
  CScript::CScript((CScript *)in_stack_fffffffffffffe18);
  CScript::operator<<((CScript *)in_stack_fffffffffffffe50,
                      (opcodetype)((ulong)in_stack_fffffffffffffe48 >> 0x20));
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_fffffffffffffe28,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20));
  b._M_extent._M_extent_value._0_7_ = in_stack_fffffffffffffe58;
  b._M_ptr = (pointer)in_stack_fffffffffffffe50;
  b._M_extent._M_extent_value._7_1_ = in_stack_fffffffffffffe5f;
  CScript::operator<<((CScript *)in_stack_fffffffffffffe38,b);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe28,
               (pointer)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20),
               (unsigned_long)in_stack_fffffffffffffe18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe18);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58),
               in_stack_fffffffffffffe50,(size_t)in_stack_fffffffffffffe48,
               (const_string *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40));
    anon_unknown_20::IsNoWitnessProgram((CScript *)in_stack_fffffffffffffe38);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffffe28,(bool)in_stack_fffffffffffffe27);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe28,
               (pointer)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20),
               (unsigned_long)in_stack_fffffffffffffe18);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20),
               (basic_cstring<const_char> *)in_stack_fffffffffffffe18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe28,
               (pointer)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20),
               (unsigned_long)in_stack_fffffffffffffe18);
    in_stack_fffffffffffffe18 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_90,local_b0,(const_string *)&stack0xffffffffffffff30,0x7e,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffffe18);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffe18);
    in_stack_fffffffffffffe5f = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffffe5f);
  CScript::clear((CScript *)in_stack_fffffffffffffe18);
  opcode = (opcodetype)((ulong)in_stack_fffffffffffffe48 >> 0x20);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe38,
             CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30));
  file = (const_string *)CScript::operator<<((CScript *)in_stack_fffffffffffffe50,opcode);
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_fffffffffffffe28,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20));
  b_00._M_extent._M_extent_value._0_7_ = in_stack_fffffffffffffe58;
  b_00._M_ptr = (pointer)file;
  b_00._M_extent._M_extent_value._7_1_ = in_stack_fffffffffffffe5f;
  CScript::operator<<((CScript *)in_stack_fffffffffffffe38,b_00);
  do {
    line_num = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe28,
               (pointer)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20),
               (unsigned_long)in_stack_fffffffffffffe18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe18);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58),file
               ,line_num,
               (const_string *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40));
    in_stack_fffffffffffffe47 =
         anon_unknown_20::IsNoWitnessProgram((CScript *)in_stack_fffffffffffffe38);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffffe28,(bool)in_stack_fffffffffffffe27);
    in_stack_fffffffffffffe38 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe28,
               (pointer)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20),
               (unsigned_long)in_stack_fffffffffffffe18);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20),
               (basic_cstring<const_char> *)in_stack_fffffffffffffe18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe28,
               (pointer)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20),
               (unsigned_long)in_stack_fffffffffffffe18);
    in_stack_fffffffffffffe18 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_118,local_138,local_158,0x83,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffffe18);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffe18);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  CScript::~CScript((CScript *)in_stack_fffffffffffffe18);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe28);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(IsWitnessProgram_Invalid_Size)
{
    std::vector<unsigned char> program(1);
    CScript nowit;
    nowit << OP_0 << program;
    BOOST_CHECK(IsNoWitnessProgram(nowit));

    nowit.clear();
    program.resize(41);
    nowit << OP_0 << program;
    BOOST_CHECK(IsNoWitnessProgram(nowit));
}